

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O0

void __thiscall
Memory::Recycler::AutoSetupRecyclerForNonCollectingMark::SetupForHeapEnumeration
          (AutoSetupRecyclerForNonCollectingMark *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  AutoSetupRecyclerForNonCollectingMark *this_local;
  
  if ((this->m_recycler->isHeapEnumInProgress & 1U) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x1f1b,"(!m_recycler.isHeapEnumInProgress)",
                       "!m_recycler.isHeapEnumInProgress");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if ((this->m_recycler->allowAllocationDuringHeapEnum & 1U) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x1f1c,"(!m_recycler.allowAllocationDuringHeapEnum)",
                       "!m_recycler.allowAllocationDuringHeapEnum");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  EnsureNotCollecting(this->m_recycler);
  DoCommonSetup(this);
  Recycler::ResetMarks(this->m_recycler,ResetMarkFlags_HeapEnumeration);
  SetCollectionState(this->m_recycler,CollectionStateNotCollecting);
  this->m_recycler->isHeapEnumInProgress = true;
  this->m_recycler->isCollectionDisabled = true;
  return;
}

Assistant:

void Recycler::AutoSetupRecyclerForNonCollectingMark::SetupForHeapEnumeration()
{
    Assert(!m_recycler.isHeapEnumInProgress);
    Assert(!m_recycler.allowAllocationDuringHeapEnum);
    m_recycler.EnsureNotCollecting();
    DoCommonSetup();
    m_recycler.ResetMarks(ResetMarkFlags_HeapEnumeration);
    m_recycler.SetCollectionState(CollectionStateNotCollecting);
    m_recycler.isHeapEnumInProgress = true;
    m_recycler.isCollectionDisabled = true;
}